

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

char * bson_iter_regex(bson_iter_t *iter,char **options)

{
  size_t *psVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  int64_t iVar6;
  _Bool _Var7;
  int iVar8;
  uint8_t *puVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  code *pcVar13;
  bson_oid_t *pbVar14;
  char *__s;
  size_t nbytes;
  ulong uVar15;
  void *pvVar16;
  uint32_t uVar17;
  long *in_RCX;
  uint8_t *puVar18;
  undefined8 uVar19;
  int32_t iVar20;
  undefined4 *extraout_RDX;
  ulong *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var21;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar22;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar23;
  uint uVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [43];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar18 = iter->raw;
    if (puVar18[iter->type] == '\v') {
      puVar9 = puVar18 + iter->d1;
      puVar18 = puVar18 + iter->d2;
    }
    else {
      puVar9 = (uint8_t *)0x0;
      puVar18 = (uint8_t *)0x0;
    }
    if (options != (char **)0x0) {
      *options = (char *)puVar18;
    }
    return (char *)puVar9;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if ((bson_t *)options != (bson_t *)0x0) {
        ((bson_t *)options)->flags = 0;
      }
      return (char *)0x0;
    }
    if ((bson_t *)options != (bson_t *)0x0) {
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)options)->flags = iVar8 - 1;
    }
    return (char *)(puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   );
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar24 = iVar8 - 1;
      puVar18 = puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar24 = 0;
      puVar18 = (uint8_t *)0x0;
    }
    if (puVar18 == (uint8_t *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)bson_malloc0((ulong)(uVar24 + 1));
      memcpy(pcVar10,puVar18,(ulong)uVar24);
      pcVar10[uVar24] = '\0';
    }
    if ((bson_t *)options != (bson_t *)0x0) {
      ((bson_t *)options)->flags = uVar24;
    }
    return pcVar10;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if ((bson_t *)options != (bson_t *)0x0) {
        ((bson_t *)options)->flags = 0;
      }
      return (char *)0x0;
    }
    if ((bson_t *)options != (bson_t *)0x0) {
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)options)->flags = iVar8 - 1;
    }
    return (char *)(puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   );
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)options != (bson_t *)0x0) {
        ((bson_t *)options)->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = 0;
      }
      return (char *)0x0;
    }
    if ((bson_t *)options == (bson_t *)0x0) {
LAB_001113bb:
      *extraout_RDX =
           *(undefined4 *)
            (puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (long)(puVar18 +
                      *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (char *)(uint8_t *)
                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                     (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    if (*(int *)(puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)options)->flags =
           *(int *)(puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (ulong *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)options != (bson_t *)0x0) {
        uVar24 = *(uint *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar18 = (uint8_t *)(ulong)uVar24;
        ((bson_t *)options)->flags = uVar24;
        if (uVar24 != 0) {
          puVar18 = (uint8_t *)(ulong)(uVar24 - 1);
          ((bson_t *)options)->flags = uVar24 - 1;
        }
      }
      if (extraout_RDX_00 != (ulong *)0x0) {
        puVar18 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_00 = (ulong)puVar18;
      }
      if (in_RCX != (long *)0x0) {
        puVar18 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (long)puVar18;
      }
    }
    return (char *)puVar18;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      puVar9 = puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar17 = iVar8 - 1;
    }
    else {
      puVar9 = (uint8_t *)0x0;
      uVar17 = 0;
    }
    if ((bson_t *)options != (bson_t *)0x0) {
      ((bson_t *)options)->flags = uVar17;
    }
    return (char *)puVar9;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return *(char **)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return (char *)(*(ulong *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) /
                   1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar17 = 0;
    pcVar10 = (char *)0x0;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      pcVar10 = *(char **)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar17 = (uint32_t)((ulong)pcVar10 >> 0x20);
    }
    if ((bson_t *)options != (bson_t *)0x0) {
      ((bson_t *)options)->flags = uVar17;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)pcVar10;
    }
    return pcVar10;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      *options = (char *)0x0;
      ((bson_t *)options)->padding[0] = '\0';
      ((bson_t *)options)->padding[1] = '\0';
      ((bson_t *)options)->padding[2] = '\0';
      ((bson_t *)options)->padding[3] = '\0';
      ((bson_t *)options)->padding[4] = '\0';
      ((bson_t *)options)->padding[5] = '\0';
      ((bson_t *)options)->padding[6] = '\0';
      ((bson_t *)options)->padding[7] = '\0';
      return (char *)puVar18;
    }
    lVar22 = *(long *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *options = (char *)(lVar22 / 1000);
    pcVar10 = (char *)((lVar22 % 1000) * 1000);
    *(char **)((bson_t *)options)->padding = pcVar10;
    return pcVar10;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)options != (bson_t *)0x0) {
    _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var7) {
      do {
        puVar18 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar11 = strlen((char *)puStack_208);
          _Var7 = bson_utf8_validate((char *)puVar18,sVar11,false);
          if (!_Var7) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if (((code *)*options != (code *)0x0) &&
           (uVar12 = (*(code *)*options)(iter,puVar18,extraout_RDX_02), (char)uVar12 != '\0'))
        goto LAB_00111b92;
        switch(uStack_210) {
        case 1:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x10);
          if (pcVar13 == (code *)0x0) break;
          dVar5 = bson_iter_double(iter);
          uVar12 = (*pcVar13)(SUB84(dVar5,0),iter,puVar18,extraout_RDX_02);
          goto LAB_00111ad6;
        case 2:
          pcVar10 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) {
LAB_00111b8c:
            uVar24 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar12 = (ulong)uVar24;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar24;
            goto LAB_00111b92;
          }
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var7) {
            pcVar13 = *(code **)(((bson_t *)options)->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var7) {
            pcVar13 = *(code **)(((bson_t *)options)->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(((bson_t *)options)->padding + 0x30) != (code *)0x0) {
            uVar12 = (**(code **)(((bson_t *)options)->padding + 0x30))
                               (iter,puVar18,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x40);
          if (pcVar13 != (code *)0x0) {
            pbVar14 = bson_iter_oid(iter);
LAB_00111ac7:
            uVar12 = (*pcVar13)(iter,puVar18,pbVar14,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x48);
          if (pcVar13 != (code *)0x0) {
            _Var7 = bson_iter_bool(iter);
            uVar24 = (uint)_Var7;
LAB_00111934:
            uVar12 = (*pcVar13)(iter,puVar18,uVar24,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x50);
          if (pcVar13 != (code *)0x0) {
            pbVar14 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x58);
LAB_001119ae:
          if (pcVar13 == (code *)0x0) break;
LAB_001119bd:
          uVar12 = (*pcVar13)(iter,puVar18,extraout_RDX_02);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar11 = strlen(__s);
          _Var7 = bson_utf8_validate(__s,sVar11,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x60);
          pcVar10 = apcStack_200[0];
          if (pcVar13 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var7 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x68);
          pcVar10 = apcStack_200[0];
          pbVar23 = pbStack_218;
          if (pcVar13 != (code *)0x0) {
LAB_001117cc:
            uVar12 = (*pcVar13)(iter,puVar18,uStack_220,pcVar10,pbVar23,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar10 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar13 = *(code **)(((bson_t *)options)->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar10 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar13 = *(code **)((long)options + 0x80);
LAB_001119f8:
          if (pcVar13 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_00111aaf:
            uVar12 = (*pcVar13)(iter,puVar18,__s,pcVar10,extraout_RDX_02);
LAB_00111ad6:
            if ((char)uVar12 != '\0') goto LAB_00111b92;
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar10 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)uStack_220,true);
          if (!_Var7) goto LAB_00111b8c;
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var7) &&
             (pcVar13 = *(code **)((bson_t *)((long)options + 0x80))->padding,
             pcVar13 != (code *)0x0)) {
            pbVar23 = (bson_t *)apcStack_200;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar13 = *(code **)(((bson_t *)((long)options + 0x80))->padding + 8);
          if (pcVar13 != (code *)0x0) {
            uVar24 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(((bson_t *)((long)options + 0x80))->padding + 0x10) != (code *)0x0) {
            uVar12 = (**(code **)(((bson_t *)((long)options + 0x80))->padding + 0x10))
                               (iter,puVar18,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar13 = *(code **)(((bson_t *)((long)options + 0x80))->padding + 0x18);
          if (pcVar13 != (code *)0x0) {
            pbVar14 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar13 = *(code **)(((bson_t *)((long)options + 0x80))->padding + 0x38);
LAB_00111a42:
          if (pcVar13 != (code *)0x0) {
            uVar12 = (*pcVar13)(iter,puVar18,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar13 = *(code **)(((bson_t *)((long)options + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar13 = *(code **)(((bson_t *)((long)options + 0x80))->padding + 0x28);
          }
          if (pcVar13 == (code *)0x0) break;
          puVar18 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)((bson_t *)options)->padding != (code *)0x0) &&
           (uVar12 = (**(code **)((bson_t *)options)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), (char)uVar12 != '\0')) {
LAB_00111b92:
          return (char *)CONCAT71((int7)(uVar12 >> 8),1);
        }
        _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var7);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) &&
         (*(long *)(((bson_t *)((long)options + 0x80))->padding + 0x30) != 0)) {
        sVar11 = strlen((char *)puStack_208);
        _Var7 = bson_utf8_validate((char *)puStack_208,sVar11,false);
        if (_Var7) {
          (**(code **)(((bson_t *)((long)options + 0x80))->padding + 0x30))
                    (iter,puStack_208,uStack_210,extraout_RDX_02);
          return (char *)0x0;
        }
      }
      if (*(code **)(((bson_t *)options)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)options)->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return (char *)0x0;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)options;
    }
    return (char *)puVar18;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)options;
    }
    return (char *)puVar18;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(char ***)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = options;
    }
    return (char *)puVar18;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (char *)puVar18;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar18[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar24 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar22 = *(long *)((bson_t *)options)->padding;
      *(char **)(puVar18 + uVar24) = *options;
      *(long *)((long)(puVar18 + uVar24) + 8) = lVar22;
    }
    return (char *)puVar18;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)options != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)options;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      uVar24 = 0;
      while( true ) {
        sVar3 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          uVar24 = 0xffffffff;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar18 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar18,puVar18 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          uVar24 = 1;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar12 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar12 != 0xffffffffffffffff) &&
           (uVar4 = ((bson_json_reader_t *)iter)->json->pos, uVar15 = uVar4 - uVar12,
           uVar12 <= uVar4 && uVar15 != 0)) {
          if (uVar15 < nbytes) {
            nbytes = uVar15;
          }
          lVar22 = uVar12 - sVar3;
          if (lVar22 < 1) {
            lVar22 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar22,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        uVar24 = 1;
      }
      uVar24 = 0xffffffff;
LAB_00111fff:
      if ((uVar24 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        uVar24 = 0xffffffff;
      }
      return (char *)(ulong)uVar24;
    }
    bson_json_reader_read_cold_1();
    p_Var21 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var21 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var21 + __n + 1) {
      uVar12 = (ulong)(p_Var21 + __n) >> 1 | (ulong)(p_Var21 + __n);
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      uVar12 = uVar12 >> 0x10 | uVar12;
      num_bytes = (bson_json_reader_cb)((uVar12 >> 0x20 | uVar12) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar16 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar16;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,options,__n);
    p_Var21 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var21;
    pcVar10 = (char *)(((bson_json_reader_t *)iter)->producer).data;
    pcVar10[(long)p_Var21] = '\0';
    return pcVar10;
  }
  puVar18 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar24 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar2 = puVar18[uVar24];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar2
  ;
  switch(bVar2) {
  case 1:
    dVar5 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar5;
    break;
  case 2:
    pcVar10 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar14 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var7 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var7;
    break;
  case 9:
    pcVar10 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar10 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar14 = (bson_oid_t *)0x0;
    if (puVar18[uVar24] == '\f') {
      uVar24 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar8 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar18 + uVar24);
      pbVar14 = (bson_oid_t *)(puVar18 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar14,&dst->v_oid);
    break;
  case 0xd:
    if (puVar18[uVar24] == '\r') {
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar24 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8 + -1;
      puVar9 = puVar18 + uVar24;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar9 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar18[uVar24] == '\x0e') {
      puVar9 = puVar18 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar8 = 1;
      if (1 < *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar8 = *(int *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar8 = iVar8 + -1;
    }
    else {
      puVar9 = (uint8_t *)0x0;
      iVar8 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar9;
    break;
  case 0xf:
    pcVar10 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar20 = 0;
    if (puVar18[uVar24] == '\x10') {
      iVar20 = *(int32_t *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar20;
    break;
  case 0x11:
    iVar20 = 0;
    uVar19 = 0;
    if (puVar18[uVar24] == '\x11') {
      uVar19 = *(undefined8 *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar20 = (int32_t)((ulong)uVar19 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar20;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar19;
    break;
  case 0x12:
    if (puVar18[uVar24] == '\x12') {
      pcVar10 = *(char **)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar10 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar10;
    break;
  case 0x13:
    if (puVar18[uVar24] == '\x13') {
      iVar6 = *(int64_t *)
               ((long)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar18 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar6;
    }
    break;
  default:
    if ((bVar2 != BSON_TYPE_MAXKEY) && (bVar2 != 0xff)) {
      return (char *)0x0;
    }
  }
  return (char *)(bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed;
}

Assistant:

const char *
bson_iter_regex (const bson_iter_t *iter, /* IN */
                 const char **options)    /* IN */
{
   const char *ret = NULL;
   const char *ret_options = NULL;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_REGEX) {
      ret = (const char *) (iter->raw + iter->d1);
      ret_options = (const char *) (iter->raw + iter->d2);
   }

   if (options) {
      *options = ret_options;
   }

   return ret;
}